

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O2

void Waitone(IceTCommunicator self,IceTCommRequest *icet_request)

{
  MPI_Request mpi_request;
  MPI_Request local_18;
  
  if (*icet_request != (IceTCommRequest)0x0) {
    local_18 = getMPIRequest(*icet_request);
    MPI_Wait(&local_18,0);
    setMPIRequest(*icet_request,local_18);
    destroy_request(*icet_request);
    *icet_request = (IceTCommRequest)0x0;
  }
  return;
}

Assistant:

static void Waitone(IceTCommunicator self, IceTCommRequest *icet_request)
{
    MPI_Request mpi_request;

    /* To remove warning */
    (void)self;

    if (*icet_request == ICET_COMM_REQUEST_NULL) return;

    mpi_request = getMPIRequest(*icet_request);
    MPI_Wait(&mpi_request, MPI_STATUS_IGNORE);
    setMPIRequest(*icet_request, mpi_request);

    destroy_request(*icet_request);
    *icet_request = ICET_COMM_REQUEST_NULL;
}